

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O3

void os_gen_charmap_filename(char *filename,char *internal_id,char *param_3)

{
  size_t sVar1;
  size_t sVar2;
  char mapname [32];
  char acStack_38 [32];
  
  os_get_charmap(acStack_38,(int)internal_id);
  sVar1 = strlen(acStack_38);
  sVar2 = 0xff7;
  if (sVar1 < 0xff7) {
    sVar2 = sVar1;
  }
  memcpy(filename,acStack_38,sVar2);
  strcat(filename,internal_id);
  sVar2 = strlen(filename);
  builtin_strncpy(filename + sVar2,".tcp",5);
  return;
}

Assistant:

void
os_gen_charmap_filename( char* filename, char* internal_id, char* /*argv0*/ )
{
    char mapname[32];

    os_get_charmap(mapname, OS_CHARMAP_DISPLAY);

    // Theoretically, we can get mapname so long that with 4-letter
    // internal id and 4-letter extension '.tcp' it will be longer
    // than OSFNMAX. Highly unlikely, but...
    size_t len = strlen(mapname);
    if (len > OSFNMAX - 9) len = OSFNMAX - 9;

    memcpy(filename, mapname, len);
    strcat(filename, internal_id);
    strcat(filename, ".tcp");
}